

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_usadd8_riscv64(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  undefined4 local_3c;
  long lStack_38;
  uint r;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (lStack_38 = 0; lStack_38 < oprsz_00; lStack_38 = lStack_38 + 1) {
    local_3c = (uint)*(byte *)((long)a + lStack_38) + (uint)*(byte *)((long)b + lStack_38);
    if (0xff < local_3c) {
      local_3c = 0xff;
    }
    *(char *)((long)d + lStack_38) = (char)local_3c;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_usadd8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        unsigned r = *(uint8_t *)((char *)a + i) + *(uint8_t *)((char *)b + i);
        if (r > UINT8_MAX) {
            r = UINT8_MAX;
        }
        *(uint8_t *)((char *)d + i) = r;
    }
    clear_high(d, oprsz, desc);
}